

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_disk_io.cpp
# Opt level: O0

disk_io_thread_pool * __thiscall
libtorrent::mmap_disk_io::pool_for_job(mmap_disk_io *this,mmap_disk_job *j)

{
  job_action_t jVar1;
  int iVar2;
  mmap_disk_job *j_local;
  mmap_disk_io *this_local;
  
  iVar2 = libtorrent::aux::disk_io_thread_pool::max_threads(&this->m_hash_threads);
  if (iVar2 < 1) {
LAB_004063c3:
    this_local = (mmap_disk_io *)&this->m_generic_threads;
  }
  else {
    jVar1 = libtorrent::aux::disk_job::get_type(&j->super_disk_job);
    if (jVar1 != hash) {
      jVar1 = libtorrent::aux::disk_job::get_type(&j->super_disk_job);
      if (jVar1 != hash2) goto LAB_004063c3;
    }
    this_local = (mmap_disk_io *)&this->m_hash_threads;
  }
  return (disk_io_thread_pool *)this_local;
}

Assistant:

aux::disk_io_thread_pool& mmap_disk_io::pool_for_job(aux::mmap_disk_job* j)
	{
		if (m_hash_threads.max_threads() > 0
			&& (j->get_type() == aux::job_action_t::hash
				|| j->get_type() == aux::job_action_t::hash2))
			return m_hash_threads;
		else
			return m_generic_threads;
	}